

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# templated_column_writer.hpp
# Opt level: O0

void __thiscall
duckdb::StandardColumnWriter<duckdb::float_na_equal,_float,_duckdb::FloatingPointOperator>::
WriteVectorInternal<true>
          (StandardColumnWriter<duckdb::float_na_equal,_float,_duckdb::FloatingPointOperator> *this,
          WriteStream *temp_writer,ColumnWriterStatistics *stats,ColumnWriterPageState *page_state_p
          ,Vector *input_column,idx_t chunk_start,idx_t chunk_end)

{
  bool bVar1;
  StandardWriterPageState<duckdb::float_na_equal,_float,_duckdb::FloatingPointOperator> *pSVar2;
  TemplatedValidityMask<unsigned_long> *this_00;
  BssEncoder *this_01;
  string *msg;
  Allocator *in_RDI;
  ulong in_R9;
  ulong in_stack_00000008;
  float target_value_4;
  idx_t r_3;
  float target_value_3;
  float target_value_2;
  idx_t r_2;
  float target_value_1;
  float target_value;
  idx_t r_1;
  uint32_t value_index;
  float_na_equal *src_value;
  idx_t r;
  float_na_equal *data_ptr;
  ValidityMask *mask;
  StandardWriterPageState<duckdb::float_na_equal,_float,_duckdb::FloatingPointOperator> *page_state;
  WriteStream *in_stack_00001f28;
  ValidityMask *in_stack_00001f30;
  idx_t in_stack_00001f38;
  idx_t in_stack_00001f40;
  ColumnWriterStatistics *in_stack_00001f48;
  Vector *in_stack_00001f50;
  float_na_equal *in_stack_fffffffffffffef8;
  ClientContext *in_stack_ffffffffffffff00;
  allocator *this_02;
  TemplatedValidityMask<unsigned_long> *in_stack_ffffffffffffff08;
  RleBpEncoder *in_stack_ffffffffffffff10;
  float *in_stack_ffffffffffffff38;
  WriteStream *in_stack_ffffffffffffff40;
  Allocator *in_stack_ffffffffffffff48;
  DlbaEncoder *in_stack_ffffffffffffff50;
  ulong local_98;
  ulong local_80;
  ulong local_68;
  ulong local_50;
  
  pSVar2 = ColumnWriterPageState::
           Cast<duckdb::StandardWriterPageState<duckdb::float_na_equal,float,duckdb::FloatingPointOperator>>
                     ((ColumnWriterPageState *)in_stack_ffffffffffffff00);
  this_00 = &FlatVector::Validity((Vector *)0x230bb5e)->super_TemplatedValidityMask<unsigned_long>;
  FlatVector::GetData<duckdb::float_na_equal>((Vector *)0x230bb73);
  this_01 = (BssEncoder *)(ulong)pSVar2->encoding;
  switch(this_01) {
  case (BssEncoder *)0x0:
    bVar1 = TemplatedValidityMask<unsigned_long>::AllValid(this_00);
    if (bVar1) {
      TemplatedWritePlain<duckdb::float_na_equal,float,duckdb::FloatingPointOperator,true>
                (in_stack_00001f50,in_stack_00001f48,in_stack_00001f40,in_stack_00001f38,
                 in_stack_00001f30,in_stack_00001f28);
    }
    else {
      TemplatedWritePlain<duckdb::float_na_equal,float,duckdb::FloatingPointOperator,false>
                (in_stack_00001f50,in_stack_00001f48,in_stack_00001f40,in_stack_00001f38,
                 in_stack_00001f30,in_stack_00001f28);
    }
    break;
  default:
    msg = (string *)__cxa_allocate_exception(0x10);
    this_02 = (allocator *)&stack0xffffffffffffff3f;
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&stack0xffffffffffffff40,"Unknown encoding",this_02);
    InternalException::InternalException((InternalException *)this_02,msg);
    __cxa_throw(msg,&InternalException::typeinfo,InternalException::~InternalException);
  case (BssEncoder *)0x5:
    local_68 = in_R9;
    if ((pSVar2->dbp_initialized & 1U) == 0) {
      for (; local_68 < in_stack_00000008; local_68 = local_68 + 1) {
        bVar1 = TemplatedValidityMask<unsigned_long>::RowIsValid
                          (in_stack_ffffffffffffff08,(idx_t)in_stack_ffffffffffffff00);
        if (bVar1) {
          FloatingPointOperator::Operation<duckdb::float_na_equal,float>((float_na_equal)0x0);
          FloatingPointOperator::HandleStats<duckdb::float_na_equal,float>
                    ((ColumnWriterStatistics *)in_stack_ffffffffffffff00,
                     (float)((ulong)in_stack_fffffffffffffef8 >> 0x20));
          DbpEncoder::BeginWrite<float>
                    (&in_stack_ffffffffffffff50->dbp_encoder,
                     (WriteStream *)in_stack_ffffffffffffff48,(float *)in_stack_ffffffffffffff40);
          pSVar2->dbp_initialized = true;
          local_68 = local_68 + 1;
          break;
        }
      }
    }
    for (; local_68 < in_stack_00000008; local_68 = local_68 + 1) {
      FloatingPointOperator::Operation<duckdb::float_na_equal,float>((float_na_equal)0x0);
      FloatingPointOperator::HandleStats<duckdb::float_na_equal,float>
                ((ColumnWriterStatistics *)in_stack_ffffffffffffff00,
                 (float)((ulong)in_stack_fffffffffffffef8 >> 0x20));
      DbpEncoder::WriteValue<float>
                (&in_stack_ffffffffffffff50->dbp_encoder,(WriteStream *)in_stack_ffffffffffffff48,
                 (float *)in_stack_ffffffffffffff40);
    }
    break;
  case (BssEncoder *)0x6:
    local_80 = in_R9;
    if ((pSVar2->dlba_initialized & 1U) == 0) {
      for (; local_80 < in_stack_00000008; local_80 = local_80 + 1) {
        bVar1 = TemplatedValidityMask<unsigned_long>::RowIsValid
                          (in_stack_ffffffffffffff08,(idx_t)in_stack_ffffffffffffff00);
        if (bVar1) {
          FloatingPointOperator::Operation<duckdb::float_na_equal,float>((float_na_equal)0x0);
          FloatingPointOperator::HandleStats<duckdb::float_na_equal,float>
                    ((ColumnWriterStatistics *)in_stack_ffffffffffffff00,
                     (float)((ulong)in_stack_fffffffffffffef8 >> 0x20));
          ParquetWriter::GetContext((ParquetWriter *)in_RDI->free_function);
          BufferAllocator::Get(in_stack_ffffffffffffff00);
          DlbaEncoder::BeginWrite<float>
                    (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,in_stack_ffffffffffffff40,
                     in_stack_ffffffffffffff38);
          pSVar2->dlba_initialized = true;
          local_80 = local_80 + 1;
          break;
        }
      }
    }
    for (; local_80 < in_stack_00000008; local_80 = local_80 + 1) {
      FloatingPointOperator::Operation<duckdb::float_na_equal,float>((float_na_equal)0x0);
      FloatingPointOperator::HandleStats<duckdb::float_na_equal,float>
                ((ColumnWriterStatistics *)in_stack_ffffffffffffff00,
                 (float)((ulong)in_stack_fffffffffffffef8 >> 0x20));
      DlbaEncoder::WriteValue<float>
                (in_stack_ffffffffffffff50,(WriteStream *)in_stack_ffffffffffffff48,
                 (float *)in_stack_ffffffffffffff40);
    }
    break;
  case (BssEncoder *)0x8:
    local_50 = in_R9;
    if ((pSVar2->dict_written_value & 1U) == 0) {
      for (; local_50 < in_stack_00000008; local_50 = local_50 + 1) {
        bVar1 = TemplatedValidityMask<unsigned_long>::RowIsValid
                          (in_stack_ffffffffffffff08,(idx_t)in_stack_ffffffffffffff00);
        if (bVar1) {
          WriteStream::Write<unsigned_char>
                    ((WriteStream *)in_stack_ffffffffffffff00,
                     (uchar)((ulong)in_stack_fffffffffffffef8 >> 0x38));
          RleBpEncoder::BeginWrite(&pSVar2->dict_encoder);
          pSVar2->dict_written_value = true;
          break;
        }
      }
    }
    for (; local_50 < in_stack_00000008; local_50 = local_50 + 1) {
      PrimitiveDictionary<duckdb::float_na_equal,_float,_duckdb::FloatingPointOperator>::GetIndex
                ((PrimitiveDictionary<duckdb::float_na_equal,_float,_duckdb::FloatingPointOperator>
                  *)in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
      RleBpEncoder::WriteValue
                (in_stack_ffffffffffffff10,(WriteStream *)in_stack_ffffffffffffff08,
                 (uint32_t *)in_stack_ffffffffffffff00);
    }
    break;
  case (BssEncoder *)0x9:
    local_98 = in_R9;
    if ((pSVar2->bss_initialized & 1U) != 0) {
      in_stack_ffffffffffffff08 = (TemplatedValidityMask<unsigned_long> *)&pSVar2->bss_encoder;
      ParquetWriter::GetContext((ParquetWriter *)in_RDI->free_function);
      BufferAllocator::Get(in_stack_ffffffffffffff00);
      BssEncoder::BeginWrite(this_01,in_RDI);
      pSVar2->bss_initialized = true;
    }
    for (; local_98 < in_stack_00000008; local_98 = local_98 + 1) {
      FloatingPointOperator::Operation<duckdb::float_na_equal,float>((float_na_equal)0x0);
      FloatingPointOperator::HandleStats<duckdb::float_na_equal,float>
                ((ColumnWriterStatistics *)in_stack_ffffffffffffff00,
                 (float)((ulong)in_stack_fffffffffffffef8 >> 0x20));
      BssEncoder::WriteValue<float>
                ((BssEncoder *)in_stack_ffffffffffffff10,(float *)in_stack_ffffffffffffff08);
    }
  }
  return;
}

Assistant:

void WriteVectorInternal(WriteStream &temp_writer, ColumnWriterStatistics *stats,
	                         ColumnWriterPageState *page_state_p, Vector &input_column, idx_t chunk_start,
	                         idx_t chunk_end) {
		auto &page_state = page_state_p->Cast<StandardWriterPageState<SRC, TGT, OP>>();

		const auto &mask = FlatVector::Validity(input_column);
		const auto *data_ptr = FlatVector::GetData<SRC>(input_column);

		switch (page_state.encoding) {
		case duckdb_parquet::Encoding::RLE_DICTIONARY: {
			idx_t r = chunk_start;
			if (!page_state.dict_written_value) {
				// find first non-null value
				for (; r < chunk_end; r++) {
					if (!mask.RowIsValid(r)) {
						continue;
					}
					// write the bit-width as a one-byte entry and initialize writer
					temp_writer.Write<uint8_t>(page_state.dict_bit_width);
					page_state.dict_encoder.BeginWrite();
					page_state.dict_written_value = true;
					break;
				}
			}

			for (; r < chunk_end; r++) {
				if (!ALL_VALID && !mask.RowIsValid(r)) {
					continue;
				}
				const auto &src_value = data_ptr[r];
				const auto value_index = page_state.dictionary.GetIndex(src_value);
				page_state.dict_encoder.WriteValue(temp_writer, value_index);
			}
			break;
		}
		case duckdb_parquet::Encoding::DELTA_BINARY_PACKED: {
			idx_t r = chunk_start;
			if (!page_state.dbp_initialized) {
				// find first non-null value
				for (; r < chunk_end; r++) {
					if (!mask.RowIsValid(r)) {
						continue;
					}
					const TGT target_value = OP::template Operation<SRC, TGT>(data_ptr[r]);
					OP::template HandleStats<SRC, TGT>(stats, target_value);
					page_state.dbp_encoder.BeginWrite(temp_writer, target_value);
					page_state.dbp_initialized = true;
					r++; // skip over
					break;
				}
			}

			for (; r < chunk_end; r++) {
				if (!ALL_VALID && !mask.RowIsValid(r)) {
					continue;
				}
				const TGT target_value = OP::template Operation<SRC, TGT>(data_ptr[r]);
				OP::template HandleStats<SRC, TGT>(stats, target_value);
				page_state.dbp_encoder.WriteValue(temp_writer, target_value);
			}
			break;
		}
		case duckdb_parquet::Encoding::DELTA_LENGTH_BYTE_ARRAY: {
			idx_t r = chunk_start;
			if (!page_state.dlba_initialized) {
				// find first non-null value
				for (; r < chunk_end; r++) {
					if (!mask.RowIsValid(r)) {
						continue;
					}
					const TGT target_value = OP::template Operation<SRC, TGT>(data_ptr[r]);
					OP::template HandleStats<SRC, TGT>(stats, target_value);
					page_state.dlba_encoder.BeginWrite(BufferAllocator::Get(writer.GetContext()), temp_writer,
					                                   target_value);
					page_state.dlba_initialized = true;
					r++; // skip over
					break;
				}
			}

			for (; r < chunk_end; r++) {
				if (!ALL_VALID && !mask.RowIsValid(r)) {
					continue;
				}
				const TGT target_value = OP::template Operation<SRC, TGT>(data_ptr[r]);
				OP::template HandleStats<SRC, TGT>(stats, target_value);
				page_state.dlba_encoder.WriteValue(temp_writer, target_value);
			}
			break;
		}
		case duckdb_parquet::Encoding::BYTE_STREAM_SPLIT: {
			if (page_state.bss_initialized) {
				page_state.bss_encoder.BeginWrite(BufferAllocator::Get(writer.GetContext()));
				page_state.bss_initialized = true;
			}
			for (idx_t r = chunk_start; r < chunk_end; r++) {
				if (!ALL_VALID && !mask.RowIsValid(r)) {
					continue;
				}
				const TGT target_value = OP::template Operation<SRC, TGT>(data_ptr[r]);
				OP::template HandleStats<SRC, TGT>(stats, target_value);
				page_state.bss_encoder.WriteValue(target_value);
			}
			break;
		}
		case duckdb_parquet::Encoding::PLAIN: {
			D_ASSERT(page_state.encoding == duckdb_parquet::Encoding::PLAIN);
			if (mask.AllValid()) {
				TemplatedWritePlain<SRC, TGT, OP, true>(input_column, stats, chunk_start, chunk_end, mask, temp_writer);
			} else {
				TemplatedWritePlain<SRC, TGT, OP, false>(input_column, stats, chunk_start, chunk_end, mask,
				                                         temp_writer);
			}
			break;
		}
		default:
			throw InternalException("Unknown encoding");
		}
	}